

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O3

Vec_Int_t * Seg_ManConvertResult(Seg_Man_t *p)

{
  int Entry;
  Vec_Int_t *p_00;
  int *piVar1;
  Vec_Int_t *pVVar2;
  long lVar3;
  int iVar4;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar1 = (int *)malloc(4000);
  p_00->pArray = piVar1;
  pVVar2 = p->vEdges;
  if (1 < pVVar2->nSize) {
    iVar4 = 1;
    lVar3 = 0;
    do {
      if (p->pSat->size <= (int)lVar3) {
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0xda,"int sat_solver_var_value(sat_solver *, int)");
      }
      if (p->pSat->model[lVar3] == 1) {
        Entry = pVVar2->pArray[lVar3 * 2 + 1];
        Vec_IntPush(p_00,pVVar2->pArray[lVar3 * 2]);
        Vec_IntPush(p_00,Entry);
        pVVar2 = p->vEdges;
      }
      lVar3 = lVar3 + 1;
      iVar4 = iVar4 + 2;
    } while (iVar4 < pVVar2->nSize);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Seg_ManConvertResult( Seg_Man_t * p )
{
    int iFanin, iObj, i;
    Vec_Int_t * vEdges2 = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntryDouble( p->vEdges, iFanin, iObj, i )
        if ( sat_solver_var_value(p->pSat, i/2) )
            Vec_IntPushTwo( vEdges2, iFanin, iObj );
    return vEdges2;
}